

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

Boxed_Value chaiscript::void_var(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  Boxed_Value BVar3;
  Void_Type local_9;
  
  if (void_var()::v == '\0') {
    iVar2 = __cxa_guard_acquire(&void_var()::v);
    in_RDX._M_pi = extraout_RDX;
    if (iVar2 != 0) {
      Boxed_Value::Boxed_Value<chaiscript::Boxed_Value::Void_Type,void>(&void_var::v,&local_9,false)
      ;
      __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
      __cxa_guard_release(&void_var()::v);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  (in_RDI->m_type_info).m_type_info =
       (type_info *)
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (in_RDI->m_type_info).m_bare_type_info =
       (type_info *)
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value void_var() {
    static const auto v = Boxed_Value(Boxed_Value::Void_Type());
    return v;
  }